

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)16>,true>
          (Thread *this)

{
  char cVar1;
  char cVar2;
  Simd<short,_(unsigned_char)__b_> value;
  char *pcVar3;
  short *psVar4;
  byte local_41;
  undefined1 auStack_40 [6];
  u8 laneidx;
  u8 i;
  Simd<short,_(unsigned_char)__b_> result;
  Simd<signed_char,_(unsigned_char)__x10_> lhs;
  Simd<signed_char,_(unsigned_char)__x10_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this);
  for (local_41 = 0; local_41 < 8; local_41 = local_41 + 1) {
    pcVar3 = Simd<signed_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<signed_char,_(unsigned_char)__x10_> *)(result.v + 4),local_41);
    cVar1 = *pcVar3;
    pcVar3 = Simd<signed_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<signed_char,_(unsigned_char)__x10_> *)(lhs.v + 8),local_41);
    cVar2 = *pcVar3;
    psVar4 = Simd<short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<short,_(unsigned_char)__b_> *)auStack_40,local_41);
    *psVar4 = (short)cVar1 * (short)cVar2;
  }
  value.v[4] = result.v[0];
  value.v[5] = result.v[1];
  value.v[6] = result.v[2];
  value.v[7] = result.v[3];
  value.v[0] = auStack_40._0_2_;
  value.v[1] = auStack_40._2_2_;
  value.v[2] = auStack_40._4_2_;
  value.v[3] = _laneidx;
  Push<wabt::interp::Simd<short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}